

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.cc
# Opt level: O1

bool tinyusdz::anon_unknown_240::HasPayloadRec(uint32_t depth,PrimSpec *primspec,uint32_t max_depth)

{
  PrimSpec *pPVar1;
  bool bVar2;
  PrimSpec *primspec_00;
  bool bVar3;
  
  if (max_depth < depth) {
    bVar3 = false;
  }
  else {
    bVar3 = true;
    if (primspec[0x310] == (PrimSpec)0x0) {
      primspec_00 = *(PrimSpec **)(primspec + 0x48);
      pPVar1 = *(PrimSpec **)(primspec + 0x50);
      bVar3 = primspec_00 != pPVar1;
      if (bVar3) {
        bVar2 = HasPayloadRec(depth + 1,primspec_00,max_depth);
        while (!bVar2) {
          primspec_00 = primspec_00 + 0x568;
          bVar3 = primspec_00 != pPVar1;
          if (primspec_00 == pPVar1) {
            return bVar3;
          }
          bVar2 = HasPayloadRec(depth + 1,primspec_00,max_depth);
        }
      }
    }
  }
  return bVar3;
}

Assistant:

bool HasPayloadRec(uint32_t depth, const PrimSpec &primspec,
                   const uint32_t max_depth = 1024 * 128) {
  if (depth > max_depth) {
    // too deep
    return false;
  }

  if (primspec.metas().payload) {
    return true;
  }

  for (auto &child : primspec.children()) {
    if (HasPayloadRec(depth + 1, child, max_depth)) {
      return true;
    }
  }

  return false;
}